

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

bool __thiscall libcellml::Variable::doEquals(Variable *this,EntityPtr *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EntityImpl *pEVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  size_t __n_00;
  Entity *this_01;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  byte bVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  EntityPtr local_70;
  element_type local_60;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  bVar4 = NamedEntity::doEquals(&this->super_NamedEntity,other);
  if (((bVar4) &&
      (peVar9 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      peVar9 != (element_type *)0x0)) &&
     (lVar7 = __dynamic_cast(peVar9,&Entity::typeinfo,&typeinfo,0), lVar7 != 0)) {
    this_00 = (other->super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    peVar9 = &local_60;
    lVar2 = *(long *)(*(long *)(lVar7 + 8) + 0xd0);
    local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,lVar2,*(long *)(*(long *)(lVar7 + 8) + 0xd8) + lVar2);
    __n = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&pEVar1[6].mId.field_2 + 8);
    if ((__n == local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi) &&
       ((__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
        (iVar6 = bcmp((void *)pEVar1[6].mId.field_2._M_allocated_capacity,
                      local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(size_t)__n), iVar6 == 0)))) {
      pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      local_50 = local_40;
      lVar2 = *(long *)(*(long *)(lVar7 + 8) + 0xf0);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar2,*(long *)(*(long *)(lVar7 + 8) + 0xf8) + lVar2);
      plVar3 = local_50;
      __n_00 = *(size_t *)((long)&pEVar1[7].mId.field_2 + 8);
      if (__n_00 == local_48) {
        if (__n_00 == 0) {
          bVar4 = true;
        }
        else {
          iVar6 = bcmp((void *)pEVar1[7].mId.field_2._M_allocated_capacity,local_50,__n_00);
          bVar4 = iVar6 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
    }
    else {
      bVar4 = false;
    }
    if (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr != peVar9)
    {
      operator_delete(local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(long)local_60._vptr_Entity + 1);
    }
    if (bVar4) {
      this_01 = (Entity *)
                (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[8].mId.field_2.
                _M_allocated_capacity;
      if (this_01 == (Entity *)0x0) {
        lVar2 = *(long *)(*(long *)(lVar7 + 8) + 0x110);
        this_02._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(lVar7 + 8) + 0x118);
        if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
          }
          peVar9 = (element_type *)(ulong)(lVar2 == 0);
          goto LAB_002850f9;
        }
        peVar9 = (element_type *)(ulong)(lVar2 == 0);
      }
      else {
        local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)(*(long *)(lVar7 + 8) + 0x110);
        local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(lVar7 + 8) + 0x118);
        if (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        bVar5 = Entity::equals(this_01,&local_70);
        peVar9 = (element_type *)(ulong)bVar5;
        this_02._M_pi =
             local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        if (local_70.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_002850f9:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
        }
      }
    }
    bVar8 = (byte)peVar9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (bVar4) goto LAB_00285112;
  }
  bVar8 = 0;
LAB_00285112:
  return (bool)(bVar8 & 1);
}

Assistant:

bool Variable::doEquals(const EntityPtr &other) const
{
    if (NamedEntity::doEquals(other)) {
        auto variable = std::dynamic_pointer_cast<libcellml::Variable>(other);
        if ((variable != nullptr)
            && pFunc()->mInitialValue == variable->initialValue()
            && pFunc()->mInterfaceType == variable->interfaceType()) {
            if (pFunc()->mUnits != nullptr) {
                return pFunc()->mUnits->equals(variable->units());
            }

            return variable->units() == nullptr;
        }
    }
    return false;
}